

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::
reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
             conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             *i_queue,EasyRandom *param_2)

{
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar1;
  reentrant_put_transaction<int>_conflict1 transaction;
  int local_4c;
  reentrant_put_transaction<int> local_48;
  reentrant_put_transaction<int> local_30;
  
  local_4c = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_30,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             i_queue,&local_4c);
  phVar1 = local_30.m_queue;
  local_48.m_queue = local_30.m_queue;
  local_48.m_put_data.m_control_block = local_30.m_put_data.m_control_block;
  local_48.m_put_data.m_user_storage = local_30.m_put_data.m_user_storage;
  local_30.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_30);
  exception_checkpoint();
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)phVar1;
  (__return_storage_ptr__->m_put_data).m_control_block = local_48.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_data).m_user_storage = local_48.m_put_data.m_user_storage;
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(1);
                exception_checkpoint();
                return std::move(transaction);
            }